

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  value_type *pvVar1;
  value_type_conflict *pvVar2;
  int local_1c;
  int i;
  int old_size;
  int new_size_local;
  ImFont *this_local;
  
  if ((this->IndexXAdvance).Size != (this->IndexLookup).Size) {
    __assert_fail("IndexXAdvance.Size == IndexLookup.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x6d8,"void ImFont::GrowIndex(int)");
  }
  local_1c = (this->IndexLookup).Size;
  if (local_1c < new_size) {
    ImVector<float>::resize(&this->IndexXAdvance,new_size);
    ImVector<unsigned_short>::resize(&this->IndexLookup,new_size);
    for (; local_1c < new_size; local_1c = local_1c + 1) {
      pvVar1 = ImVector<float>::operator[](&this->IndexXAdvance,local_1c);
      *pvVar1 = -1.0;
      pvVar2 = ImVector<unsigned_short>::operator[](&this->IndexLookup,local_1c);
      *pvVar2 = 0xffff;
    }
  }
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexXAdvance.Size == IndexLookup.Size);
    int old_size = IndexLookup.Size;
    if (new_size <= old_size)
        return;
    IndexXAdvance.resize(new_size);
    IndexLookup.resize(new_size);
    for (int i = old_size; i < new_size; i++)
    {
        IndexXAdvance[i] = -1.0f;
        IndexLookup[i] = (unsigned short)-1;
    }
}